

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
* __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
get_simplex_address(optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                    *__return_storage_ptr__,
                   Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                   *this,Root_simplex_handle *s)

{
  bool bVar1;
  reference pRVar2;
  reference_type pVVar3;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> local_80;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> address;
  _Self local_70;
  const_iterator i;
  undefined1 local_58 [8];
  Simplex s_address;
  Root_simplex_handle *s_local;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  *res;
  
  s_address.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  boost::
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::optional(__return_storage_ptr__);
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<>
            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *)local_58);
  local_70._M_node =
       (_Base_ptr)
       Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>
       ::begin(s);
  while( true ) {
    address.super_type =
         (type)Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>
               ::end(s);
    bVar1 = std::operator!=(&local_70,(_Self *)&address);
    if (!bVar1) break;
    pRVar2 = std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>
             ::operator*(&local_70);
    (*this->_vptr_Skeleton_blocker_complex[3])(&local_80,this,(ulong)(uint)pRVar2->vertex);
    bVar1 = boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            ::operator!(&local_80);
    if (bVar1) {
      s_address.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
    }
    else {
      pVVar3 = boost::
               optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
               operator*(&local_80);
      Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
      ::add_vertex((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *)local_58,(Vertex_handle)pVVar3->vertex);
    }
    boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
    ~optional(&local_80);
    if (bVar1) goto LAB_001278fd;
    std::
    _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>
    ::operator++(&local_70);
  }
  boost::
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
  ::operator=((optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
               *)__return_storage_ptr__,
              (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
               *)local_58);
  s_address.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
LAB_001278fd:
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  ~Skeleton_blocker_simplex
            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *)local_58);
  if ((s_address.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    boost::
    optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
    ::~optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Simplex> get_simplex_address(
                                               const Root_simplex_handle& s) const {
    boost::optional<Simplex> res;

    Simplex s_address;
    // Root_simplex_const_iterator i;
    for (auto i = s.begin(); i != s.end(); ++i) {
      boost::optional<Vertex_handle> address = get_address(*i);
      if (!address)
        return res;
      else
        s_address.add_vertex(*address);
    }
    res = s_address;
    return res;
  }